

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_attribute *proto,xml_attribute *attr)

{
  xml_node_struct *node;
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  bool bVar3;
  uint uVar4;
  xml_allocator *alloc;
  xml_attribute_struct *da;
  xml_attribute_struct **ppxVar5;
  
  if ((((proto->_attr != (xml_attribute_struct *)0x0) &&
       (node = this->_root, node != (xml_node_struct *)0x0)) &&
      ((uVar4 = (uint)node->header & 0xf, uVar4 == 7 || (uVar4 == 2)))) &&
     ((attr->_attr != (xml_attribute_struct *)0x0 &&
      (bVar3 = impl::anon_unknown_0::is_attribute_of(attr->_attr,node), bVar3)))) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(node);
    da = impl::anon_unknown_0::allocate_attribute(alloc);
    if (da != (xml_attribute_struct *)0x0) {
      pxVar1 = attr->_attr;
      pxVar2 = pxVar1->prev_attribute_c;
      ppxVar5 = &this->_root->first_attribute;
      if (pxVar2->next_attribute != (xml_attribute_struct *)0x0) {
        ppxVar5 = &pxVar2->next_attribute;
      }
      *ppxVar5 = da;
      da->prev_attribute_c = pxVar2;
      da->next_attribute = pxVar1;
      pxVar1->prev_attribute_c = da;
      impl::anon_unknown_0::node_copy_attribute(da,proto->_attr);
      return (xml_attribute)da;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}